

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkRenderingInputAttachmentIndexInfoKHR *info,ScratchAllocator *alloc)

{
  VkRenderingInputAttachmentIndexInfo *pVVar1;
  uint *puVar2;
  
  pVVar1 = copy<VkRenderingInputAttachmentIndexInfo>(this,info,1,alloc);
  if (pVVar1->pColorAttachmentInputIndices != (uint *)0x0) {
    puVar2 = copy<unsigned_int>(this,pVVar1->pColorAttachmentInputIndices,
                                (ulong)info->colorAttachmentCount,alloc);
    pVVar1->pColorAttachmentInputIndices = puVar2;
  }
  if (pVVar1->pDepthInputAttachmentIndex != (uint *)0x0) {
    puVar2 = copy<unsigned_int>(this,pVVar1->pDepthInputAttachmentIndex,1,alloc);
    pVVar1->pDepthInputAttachmentIndex = puVar2;
  }
  if (pVVar1->pStencilInputAttachmentIndex != (uint *)0x0) {
    puVar2 = copy<unsigned_int>(this,pVVar1->pStencilInputAttachmentIndex,1,alloc);
    pVVar1->pStencilInputAttachmentIndex = puVar2;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkRenderingInputAttachmentIndexInfoKHR *info, ScratchAllocator &alloc)
{
	auto *loc_info = copy(info, 1, alloc);
	if (loc_info->pColorAttachmentInputIndices)
		loc_info->pColorAttachmentInputIndices = copy(loc_info->pColorAttachmentInputIndices, info->colorAttachmentCount, alloc);
	if (loc_info->pDepthInputAttachmentIndex)
		loc_info->pDepthInputAttachmentIndex = copy(loc_info->pDepthInputAttachmentIndex, 1, alloc);
	if (loc_info->pStencilInputAttachmentIndex)
		loc_info->pStencilInputAttachmentIndex = copy(loc_info->pStencilInputAttachmentIndex, 1, alloc);
	return loc_info;
}